

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

TArray<FName,_FName> * MakeStateNameList(char *fname)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FName local_3c;
  char *pcStack_38;
  FName cc;
  char *name;
  char *c;
  FName local_20;
  FName secondpart;
  FName firstpart;
  char *fname_local;
  
  if ((MakeStateNameList(char_const*)::namelist == '\0') &&
     (iVar2 = __cxa_guard_acquire(&MakeStateNameList(char_const*)::namelist), iVar2 != 0)) {
    TArray<FName,_FName>::TArray(&MakeStateNameList::namelist,3);
    __cxa_atexit(TArray<FName,_FName>::~TArray,&MakeStateNameList::namelist,&__dso_handle);
    __cxa_guard_release(&MakeStateNameList(char_const*)::namelist);
  }
  FName::FName(&local_20);
  FName::FName((FName *)((long)&c + 4));
  pcStack_38 = copystring(fname);
  pcVar3 = strtok(pcStack_38,".");
  FName::operator=(&local_20,pcVar3);
  iVar2 = FName::operator_cast_to_int(&local_20);
  if (iVar2 == 0x33) {
    FName::operator=(&local_20,NAME_Death);
    FName::operator=((FName *)((long)&c + 4),NAME_Ice);
  }
  else if (iVar2 == 0x9c) {
    FName::operator=(&local_20,NAME_Death);
    FName::operator=((FName *)((long)&c + 4),NAME_Extreme);
  }
  else if (iVar2 == 0x9d) {
    FName::operator=(&local_20,NAME_Death);
    FName::operator=((FName *)((long)&c + 4),NAME_Fire);
  }
  else if (iVar2 == 0x9e) {
    FName::operator=(&local_20,NAME_Death);
    FName::operator=((FName *)((long)&c + 4),NAME_Disintegrate);
  }
  TArray<FName,_FName>::Clear(&MakeStateNameList::namelist);
  TArray<FName,_FName>::Push(&MakeStateNameList::namelist,&local_20);
  bVar1 = FName::operator!=((FName *)((long)&c + 4),NAME_None);
  if (bVar1) {
    TArray<FName,_FName>::Push(&MakeStateNameList::namelist,(FName *)((long)&c + 4));
  }
  while (pcVar3 = strtok((char *)0x0,"."), pcVar3 != (char *)0x0) {
    FName::FName(&local_3c,pcVar3);
    TArray<FName,_FName>::Push(&MakeStateNameList::namelist,&local_3c);
  }
  if (pcStack_38 != (char *)0x0) {
    operator_delete__(pcStack_38);
  }
  return &MakeStateNameList::namelist;
}

Assistant:

TArray<FName> &MakeStateNameList(const char * fname)
{
	static TArray<FName> namelist(3);
	FName firstpart, secondpart;
	char *c;

	// Handle the old names for the existing death states
	char *name = copystring(fname);
	firstpart = strtok(name, ".");
	switch (firstpart)
	{
	case NAME_Burn:
		firstpart = NAME_Death;
		secondpart = NAME_Fire;
		break;
	case NAME_Ice:
		firstpart = NAME_Death;
		secondpart = NAME_Ice;
		break;
	case NAME_Disintegrate:
		firstpart = NAME_Death;
		secondpart = NAME_Disintegrate;
		break;
	case NAME_XDeath:
		firstpart = NAME_Death;
		secondpart = NAME_Extreme;
		break;
	}

	namelist.Clear();
	namelist.Push(firstpart);
	if (secondpart != NAME_None)
	{
		namelist.Push(secondpart);
	}

	while ((c = strtok(NULL, ".")) != NULL)
	{
		FName cc = c;
		namelist.Push(cc);
	}
	delete[] name;
	return namelist;
}